

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Choice.cpp
# Opt level: O1

VirtualIterator<Kernel::Clause_*> __thiscall
Inferences::Choice::ResultFn::operator()(ResultFn *this,Term *term)

{
  TermList op;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  Clause *pCVar9;
  undefined8 *puVar10;
  Term *in_RDX;
  AxiomsIterator local_e8;
  DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> local_88;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  undefined1 local_30;
  
  uVar8 = *(uint *)&in_RDX->field_0xc & 0xfffffff;
  op._content = in_RDX->_args[(ulong)uVar8 - 2]._content;
  if ((op._content & 1) == 0) {
    pCVar9 = createChoiceAxiom(op,(TermList)in_RDX->_args[(ulong)uVar8 - 3]._content);
    *(int *)(DAT_00b7e1c0 + 0x108) = *(int *)(DAT_00b7e1c0 + 0x108) + 1;
    puVar10 = (undefined8 *)
              ::Lib::FixedSizeAllocator<32UL>::alloc
                        ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    *(undefined4 *)(puVar10 + 1) = 0;
    *puVar10 = &PTR__IteratorCore_00b63388;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10[3] = pCVar9;
    *(undefined8 **)this = puVar10;
    *(undefined4 *)(puVar10 + 1) = 1;
  }
  else {
    AxiomsIterator::AxiomsIterator(&local_e8,in_RDX);
    puVar10 = (undefined8 *)::operator_new(0x70,8);
    uVar8 = local_e8._choiceOps._map._timestamp;
    iVar7 = local_e8._choiceOps._map._size;
    local_e8._choiceOps._map._timestamp = 1;
    local_e8._choiceOps._map._size = 0;
    uVar5._0_4_ = 0;
    uVar5._4_4_ = 0;
    uVar6._0_4_ = 0;
    uVar6._4_4_ = 0;
    uVar4 = CONCAT44(local_e8._choiceOps._map._afterLast._4_4_,
                     local_e8._choiceOps._map._afterLast._0_4_);
    local_e8._choiceOps._map._afterLast._0_4_ = 0;
    local_e8._choiceOps._map._afterLast._4_4_ = 0;
    *(undefined4 *)(puVar10 + 1) = 0;
    *puVar10 = &PTR__ProxyIterator_00b63ba0;
    *(undefined8 *)((long)puVar10 + 0x14) = 0;
    *(undefined8 *)((long)puVar10 + 0x1c) = 0;
    *(undefined8 *)((long)puVar10 + 0x24) = 0;
    *(undefined8 *)((long)puVar10 + 0x2c) = 0;
    *(undefined4 *)((long)puVar10 + 0x34) = 0;
    *(uint *)(puVar10 + 2) = uVar8;
    local_30 = local_e8._inBetweenNextandHasNext;
    local_40 = local_e8._headSort._content;
    uStack_38 = local_e8._set._content;
    local_50 = local_e8._nextChoiceOperator._content;
    uStack_48 = local_e8._resultSort._content;
    local_60 = local_e8._opApplied._content;
    uStack_58 = local_e8._setApplied._content;
    *(int *)((long)puVar10 + 0x14) = iVar7;
    local_88._timestamp = 1;
    local_88._size = 0;
    uVar2 = puVar10[3];
    uVar3 = puVar10[4];
    *(int *)(puVar10 + 3) = local_e8._choiceOps._map._deleted;
    *(int *)((long)puVar10 + 0x1c) = local_e8._choiceOps._map._capacityIndex;
    *(int *)(puVar10 + 4) = local_e8._choiceOps._map._capacity;
    *(int *)((long)puVar10 + 0x24) = local_e8._choiceOps._map._nextExpansionOccupancy;
    uVar1 = puVar10[5];
    local_88._afterLast._0_4_ = *(undefined4 *)(puVar10 + 6);
    puVar10[5] = local_e8._choiceOps._map._entries;
    local_88._afterLast._4_4_ = *(undefined4 *)((long)puVar10 + 0x34);
    puVar10[6] = uVar4;
    local_88._deleted = (int)uVar2;
    local_88._capacityIndex = (int)((ulong)uVar2 >> 0x20);
    local_88._capacity = (int)uVar3;
    local_88._nextExpansionOccupancy = (int)((ulong)uVar3 >> 0x20);
    local_88._entries._0_4_ = (undefined4)uVar1;
    local_88._entries._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    *(bool *)(puVar10 + 0xd) = local_e8._inBetweenNextandHasNext;
    puVar10[0xb] = local_e8._headSort._content;
    puVar10[0xc] = local_e8._set._content;
    puVar10[9] = local_e8._nextChoiceOperator._content;
    puVar10[10] = local_e8._resultSort._content;
    puVar10[7] = local_e8._opApplied._content;
    puVar10[8] = local_e8._setApplied._content;
    *(undefined4 *)(puVar10 + 1) = 1;
    *(undefined8 **)this = puVar10;
    local_e8._choiceOps._map._8_8_ = uVar5;
    local_e8._choiceOps._map._16_8_ = uVar6;
    local_e8._choiceOps._map._entries = (Entry *)0x0;
    ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_88);
    ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               &local_e8);
  }
  return (VirtualIterator<Kernel::Clause_*>)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

VirtualIterator<Clause*> operator() (Term* term){
    TermList op = *term->nthArgument(2);
    if(op.isVar()){
      return pvi(AxiomsIterator(term));
    } else {
      Clause* axiom = createChoiceAxiom(op, *term->nthArgument(3));
      env.statistics->choiceInstances++;
      return pvi(getSingletonIterator(axiom));
    }
  }